

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.h
# Opt level: O0

shared_ptr<const_lf::mesh::Mesh> __thiscall
lf::assemble::DynamicFEDofHandler::Mesh(DynamicFEDofHandler *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<const_lf::mesh::Mesh> sVar1;
  DynamicFEDofHandler *this_local;
  
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr
            ((shared_ptr<const_lf::mesh::Mesh> *)this,
             (shared_ptr<const_lf::mesh::Mesh> *)(in_RSI + 8));
  sVar1.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_lf::mesh::Mesh>)
         sVar1.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

[[nodiscard]] std::shared_ptr<const lf::mesh::Mesh> Mesh() const override {
    return mesh_p_;
  }